

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O0

void * I_FindFirst(char *filespec,findstate_t *fileinfo)

{
  int iVar1;
  char *__dir;
  FString local_38;
  char *local_30;
  char *slash;
  FString dir;
  findstate_t *fileinfo_local;
  char *filespec_local;
  
  dir.Chars = (char *)fileinfo;
  FString::FString((FString *)&slash);
  local_30 = strrchr(filespec,0x2f);
  if (local_30 == (char *)0x0) {
    pattern = filespec;
    FString::operator=((FString *)&slash,".");
  }
  else {
    pattern = local_30 + 1;
    FString::FString(&local_38,filespec,(size_t)(local_30 + (1 - (long)filespec)));
    FString::operator=((FString *)&slash,&local_38);
    FString::~FString(&local_38);
  }
  dir.Chars[0x10] = '\0';
  dir.Chars[0x11] = '\0';
  dir.Chars[0x12] = '\0';
  dir.Chars[0x13] = '\0';
  __dir = FString::GetChars((FString *)&slash);
  iVar1 = scandir(__dir,(dirent ***)(dir.Chars + 8),matchfile,alphasort);
  *(int *)dir.Chars = iVar1;
  if (*(int *)dir.Chars < 1) {
    filespec_local = (char *)0xffffffffffffffff;
  }
  else {
    filespec_local = dir.Chars;
  }
  FString::~FString((FString *)&slash);
  return filespec_local;
}

Assistant:

void *I_FindFirst (const char *filespec, findstate_t *fileinfo)
{
	FString dir;
	
	const char *slash = strrchr (filespec, '/');
	if (slash)
	{
		pattern = slash+1;
		dir = FString(filespec, slash-filespec+1);
	}
	else
	{
		pattern = filespec;
		dir = ".";
	}

    fileinfo->current = 0;
    fileinfo->count = scandir (dir.GetChars(), &fileinfo->namelist,
							   matchfile, alphasort);
    if (fileinfo->count > 0)
    {
		return fileinfo;
    }
    return (void*)-1;
}